

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O3

nvlist_t * nvlist_create(int flags)

{
  nvlist_t *pnVar1;
  
  if ((uint)flags < 4) {
    pnVar1 = (nvlist_t *)malloc(0x30);
    if (pnVar1 != (nvlist_t *)0x0) {
      pnVar1->nvl_flags = flags;
      pnVar1->nvl_parent = (nvpair_t *)0x0;
      pnVar1->nvl_array_next = (nvpair_t *)0x0;
      (pnVar1->nvl_head).tqh_first = (nvpair *)0x0;
      (pnVar1->nvl_head).tqh_last = &(pnVar1->nvl_head).tqh_first;
      pnVar1->nvl_magic = 0x6e766c;
      pnVar1->nvl_error = 0;
    }
    return pnVar1;
  }
  __assert_fail("(flags & ~((0x01 | 0x02))) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x74,"nvlist_t *nvlist_create(int)");
}

Assistant:

nvlist_t *
nvlist_create(int flags)
{
	nvlist_t *nvl;

	PJDLOG_ASSERT((flags & ~(NV_FLAG_PUBLIC_MASK)) == 0);

	nvl = nv_malloc(sizeof(*nvl));
	if (nvl == NULL)
		return (NULL);
	nvl->nvl_error = 0;
	nvl->nvl_flags = flags;
	nvl->nvl_parent = NULL;
	nvl->nvl_array_next = NULL;
	TAILQ_INIT(&nvl->nvl_head);
	nvl->nvl_magic = NVLIST_MAGIC;

	return (nvl);
}